

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_base64.cpp
# Opt level: O0

void EncodeBase64Helper3(uchar *inbuf,char *outbuf)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  char local_21;
  char local_1f;
  char local_1d;
  char local_1b;
  char local_1a;
  char local_19;
  uchar c;
  uchar b;
  char *outbuf_local;
  uchar *inbuf_local;
  
  bVar1 = *inbuf;
  uVar3 = (int)(uint)bVar1 >> 2;
  bVar2 = (byte)uVar3;
  if (bVar2 < 0x1a) {
    local_1a = bVar2 + 0x41;
  }
  else if (bVar2 < 0x34) {
    local_1a = bVar2 + 0x47;
  }
  else if (bVar2 < 0x3e) {
    local_1a = bVar2 - 4;
  }
  else {
    local_1b = '/';
    if ((uVar3 & 1) == 0) {
      local_1b = '+';
    }
    local_1a = local_1b;
  }
  *outbuf = local_1a;
  bVar2 = inbuf[1];
  uVar3 = (int)(bVar2 & 0xf0) >> 4;
  bVar1 = (bVar1 & 3) << 4 | (byte)uVar3;
  if (bVar1 < 0x1a) {
    local_1a = bVar1 + 0x41;
  }
  else if (bVar1 < 0x34) {
    local_1a = bVar1 + 0x47;
  }
  else if (bVar1 < 0x3e) {
    local_1a = bVar1 - 4;
  }
  else {
    local_1d = '/';
    if ((uVar3 & 1) == 0) {
      local_1d = '+';
    }
    local_1a = local_1d;
  }
  outbuf[1] = local_1a;
  bVar1 = inbuf[2];
  uVar3 = (int)(bVar1 & 0xc0) >> 6;
  bVar2 = (bVar2 & 0xf) << 2 | (byte)uVar3;
  if (bVar2 < 0x1a) {
    local_1a = bVar2 + 0x41;
  }
  else if (bVar2 < 0x34) {
    local_1a = bVar2 + 0x47;
  }
  else if (bVar2 < 0x3e) {
    local_1a = bVar2 - 4;
  }
  else {
    local_1f = '/';
    if ((uVar3 & 1) == 0) {
      local_1f = '+';
    }
    local_1a = local_1f;
  }
  outbuf[2] = local_1a;
  bVar2 = bVar1 & 0x3f;
  if (bVar2 < 0x1a) {
    local_19 = bVar2 + 0x41;
  }
  else if (bVar2 < 0x34) {
    local_19 = bVar2 + 0x47;
  }
  else if (bVar2 < 0x3e) {
    local_19 = bVar2 - 4;
  }
  else {
    local_21 = '/';
    if ((bVar1 & 1) == 0) {
      local_21 = '+';
    }
    local_19 = local_21;
  }
  outbuf[3] = local_19;
  return;
}

Assistant:

static void EncodeBase64Helper3(const unsigned char* inbuf, char* outbuf )
{
  // base64 encode 3 bytes from inbuf into 4 bytes of outbuf.
  unsigned char b, c;
  
  b = *inbuf++;
  c = (b >> 2);

  if ( c < 26 ) c += 65; else if ( c < 52 ) c += 71; 
  else if ( c < 62 ) c -= 4; else c = (c&1) ? '/' : '+';
  *outbuf++ = c;

  c = (b & 3) << 4;
  b = *inbuf++;
  c |= (b & 0xF0) >> 4;

  if ( c < 26 ) c += 65; else if ( c < 52 ) c += 71; 
  else if ( c < 62 ) c -= 4; else c = (c&1) ? '/' : '+';
  *outbuf++ = c;

  c = (b & 0x0F) << 2;
  b = *inbuf++;
  c |= (b&0xC0) >> 6;

  if ( c < 26 ) c += 65; else if ( c < 52 ) c += 71; 
  else if ( c < 62 ) c -= 4; else c = (c&1) ? '/' : '+';
  *outbuf++ = c;

  b &= 0x3F;
  if ( b < 26 ) b += 65; else if ( b < 52 ) b += 71; 
  else if ( b < 62 ) b -= 4; else b = (b&1) ? '/' : '+';
  *outbuf++ = b;
}